

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O1

Bool Ppmd8_RangeDec_Init(CPpmd8 *p)

{
  UInt32 UVar1;
  byte bVar2;
  int iVar3;
  
  p->Low = 0;
  p->Range = 0xffffffff;
  p->Code = 0;
  iVar3 = 4;
  do {
    UVar1 = p->Code;
    bVar2 = (*((p->Stream).In)->Read)((p->Stream).In);
    p->Code = (uint)bVar2 | UVar1 << 8;
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  return (uint)(p->Code != 0xffffffff);
}

Assistant:

Bool Ppmd8_RangeDec_Init(CPpmd8 *p)
{
  unsigned i;
  p->Low = 0;
  p->Range = 0xFFFFFFFF;
  p->Code = 0;
  for (i = 0; i < 4; i++)
    p->Code = (p->Code << 8) | p->Stream.In->Read(p->Stream.In);
  return (p->Code < 0xFFFFFFFF);
}